

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

void __thiscall hwnet::Poller::Remove(Poller *this,Ptr *channel)

{
  bool bVar1;
  __int_type_conflict _Var2;
  element_type *peVar3;
  element_type *this_00;
  bool needNotify;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false> local_30;
  int local_24;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false> local_20;
  iterator it;
  Ptr *channel_local;
  Poller *this_local;
  
  it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>._M_cur
       = (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>)
         (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>)channel
  ;
  std::mutex::lock(&this->mtx);
  peVar3 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)it.
                         super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>
                         ._M_cur);
  local_24 = (*peVar3->_vptr_Channel[1])();
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
       ::find(&this->channels,&local_24);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
       ::end(&this->channels);
  bVar1 = std::__detail::operator==(&local_20,&local_30);
  if (bVar1) {
    std::mutex::unlock(&this->mtx);
  }
  else {
    std::__cxx11::
    list<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>::
    push_back(&this->waitRemove,
              (value_type *)
              it.
              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>
              ._M_cur);
    std::
    unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
    ::erase(&this->channels,(iterator)local_20._M_cur);
    Epoll::Remove(&this->poller_,
                  (Ptr *)it.
                         super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>
                         ._M_cur);
    _Var2 = std::__atomic_base<int>::operator++(&(this->clearWaitRemove).super___atomic_base<int>);
    std::mutex::unlock(&this->mtx);
    if (_Var2 == 1) {
      this_00 = std::
                __shared_ptr_access<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->notifyChannel_);
      notifyChannel::notify(this_00);
    }
  }
  return;
}

Assistant:

void Poller::Remove(const Channel::Ptr &channel) {
	this->mtx.lock();
	auto it = this->channels.find(channel->Fd());
	if(it == this->channels.end()){
		this->mtx.unlock();
		return;		
	}
	this->waitRemove.push_back(channel);
	this->channels.erase(it);
	poller_.Remove(channel);
	auto needNotify = ++clearWaitRemove == 1;
	this->mtx.unlock();
	if(needNotify) {
		this->notifyChannel_->notify();
	}
}